

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTables::visit(SemanticTables *this,TypeDeclNode *typeDeclNode)

{
  TypeDeclNode *pTVar1;
  char *lexeme;
  bool bVar2;
  StructSymbol *pSVar3;
  VarSymbol *pVVar4;
  int iVar5;
  VarDeclNode *pVVar6;
  IdListNode *pIVar7;
  
  pTVar1 = typeDeclNode->next;
  if (pTVar1 != (TypeDeclNode *)0x0) {
    (*(pTVar1->super_ASTNode)._vptr_ASTNode[3])(pTVar1,this);
  }
  lexeme = (typeDeclNode->id->super_ExpNode).lexeme;
  if (lexeme == (char *)0x0) {
    visit((SemanticTables *)typeDeclNode);
  }
  else {
    pSVar3 = StructTable::cSearch(structTable,lexeme);
    if (pSVar3 == (StructSymbol *)0x0) {
      bVar2 = StructTable::cInsert
                        (structTable,(typeDeclNode->id->super_ExpNode).lexeme,typeDeclNode->dec);
      if (bVar2) {
        beginScope((typeDeclNode->id->super_ExpNode).lexeme);
        pVVar6 = typeDeclNode->dec;
        if (pVVar6 != (VarDeclNode *)0x0) {
          (*(pVVar6->super_ASTNode)._vptr_ASTNode[3])(pVVar6,this);
          iVar5 = 0;
          for (pVVar6 = typeDeclNode->dec; pVVar6 != (VarDeclNode *)0x0; pVVar6 = pVVar6->next) {
            for (pIVar7 = pVVar6->idlist; pIVar7 != (IdListNode *)0x0; pIVar7 = pIVar7->next) {
              pVVar4 = VarTable::searchInScope
                                 (varTable,(pIVar7->id->super_ExpNode).lexeme,
                                  (typeDeclNode->id->super_ExpNode).lexeme);
              pVVar4->offset = iVar5;
              iVar5 = iVar5 + pVVar4->size;
            }
          }
          pSVar3 = StructTable::cSearch(structTable,(typeDeclNode->id->super_ExpNode).lexeme);
          pSVar3->size = iVar5;
        }
        endScope();
        return;
      }
    }
    visit();
  }
  return;
}

Assistant:

void SemanticTables::visit(TypeDeclNode *typeDeclNode) {

    if (typeDeclNode->getNext() != NULL) {
        typeDeclNode->getNext()->accept(this);
    }

    if (!typeDeclNode->getId()->getLexeme()) {
        fprintf(stderr, "[SEMANTIC ERROR - typeDeclNode] STRUCT WITHOUT A VALID NAME, line: %d\n",
                typeDeclNode->getLine());
        return;
    }
    if (structTable->cSearch(typeDeclNode->getId()->getLexeme()) ||
        !structTable->cInsert(typeDeclNode->getId()->getLexeme(), typeDeclNode->getDecl())) {
        fprintf(stderr, "[SEMANTIC ERROR - typeDeclNode] STRUCT ALREADY EXISTS, line: %d, lexeme: %s \n",
                typeDeclNode->getLine(), typeDeclNode->getId()->getLexeme());
        return;
    }

    beginScope(typeDeclNode->getId()->getLexeme());
    if (typeDeclNode->getDecl() != NULL) {
        typeDeclNode->getDecl()->accept(this);
        VarDeclNode *varListAux = typeDeclNode->getDecl();
        int totalSizeAux = 0;
        while (varListAux != NULL) {
            IdListNode *idListAux = varListAux->getIdList();
            while (idListAux != NULL) {
                VarSymbol *var = varTable->searchInScope(idListAux->getId()->getLexeme(),
                                                         typeDeclNode->getId()->getLexeme());

                var->setOffset(totalSizeAux);
                totalSizeAux += var->getSize();
                idListAux = idListAux->getNext();
            }
            if (varListAux->getNext()) {
                varListAux = varListAux->getNext();
            } else {
                varListAux = NULL;
            }
        }
        StructSymbol *structSymbol = structTable->cSearch(typeDeclNode->getId()->getLexeme());
        structSymbol->setSize(totalSizeAux);
    }
    endScope();
}